

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vstat.cc
# Opt level: O3

bool anon_unknown.dwarf_393d::OutputStatistics
               (StatisticsAccumulation *accumulation,Buffer *buffer,int vector_length,
               OutputFormats output_format,double confidence_level,
               bool outputs_only_diagonal_elements)

{
  bool bVar1;
  size_type __n;
  int num_data_1;
  vector<double,_std::allocator<double>_> mean;
  vector<double,_std::allocator<double>_> tmp;
  int num_data;
  vector<double,_std::allocator<double>_> first;
  allocator_type local_ed;
  int local_ec;
  SymmetricMatrix local_e8;
  vector<double,_std::allocator<double>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  undefined1 local_78 [16];
  pointer local_68;
  double local_38;
  
  local_38 = confidence_level;
  if ((output_format < kSufficientStatistics) && ((0x43U >> (output_format & 0x1f) & 1) != 0)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,(long)vector_length,
               (allocator_type *)local_78);
    bVar1 = sptk::StatisticsAccumulation::GetMean
                      (accumulation,buffer,(vector<double,_std::allocator<double>_> *)&local_e8);
    if (bVar1) {
      bVar1 = sptk::WriteStream<double>
                        (0,vector_length,(vector<double,_std::allocator<double>_> *)&local_e8,
                         (ostream *)&std::cout,(int *)0x0);
    }
    else {
      bVar1 = false;
    }
    if (local_e8._vptr_SymmetricMatrix != (_func_int **)0x0) {
      operator_delete(local_e8._vptr_SymmetricMatrix);
    }
    if (bVar1 == false) {
      return false;
    }
  }
  if ((output_format & ~kCovariance) == kMeanAndCovariance) {
    if (outputs_only_diagonal_elements) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_e8,(long)vector_length,
                 (allocator_type *)local_78);
      bVar1 = sptk::StatisticsAccumulation::GetDiagonalCovariance
                        (accumulation,buffer,(vector<double,_std::allocator<double>_> *)&local_e8);
      if (bVar1) {
        bVar1 = sptk::WriteStream<double>
                          (0,vector_length,(vector<double,_std::allocator<double>_> *)&local_e8,
                           (ostream *)&std::cout,(int *)0x0);
      }
      else {
        bVar1 = false;
      }
      if (local_e8._vptr_SymmetricMatrix != (_func_int **)0x0) {
        operator_delete(local_e8._vptr_SymmetricMatrix);
      }
      if (bVar1 == false) {
        return false;
      }
    }
    else {
      sptk::SymmetricMatrix::SymmetricMatrix(&local_e8,vector_length);
      bVar1 = sptk::StatisticsAccumulation::GetFullCovariance(accumulation,buffer,&local_e8);
      if ((!bVar1) || (bVar1 = sptk::WriteStream(&local_e8,(ostream *)&std::cout), !bVar1))
      goto LAB_00105d81;
      sptk::SymmetricMatrix::~SymmetricMatrix(&local_e8);
    }
  }
  switch(output_format) {
  case kStandardDeviation:
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,(long)vector_length,
               (allocator_type *)local_78);
    bVar1 = sptk::StatisticsAccumulation::GetStandardDeviation
                      (accumulation,buffer,(vector<double,_std::allocator<double>_> *)&local_e8);
    if (bVar1) {
      bVar1 = sptk::WriteStream<double>
                        (0,vector_length,(vector<double,_std::allocator<double>_> *)&local_e8,
                         (ostream *)&std::cout,(int *)0x0);
    }
    else {
LAB_00105d3e:
      bVar1 = false;
    }
    break;
  case kCorrelation:
    sptk::SymmetricMatrix::SymmetricMatrix(&local_e8,vector_length);
    bVar1 = sptk::StatisticsAccumulation::GetCorrelation(accumulation,buffer,&local_e8);
    if ((bVar1) && (bVar1 = sptk::WriteStream(&local_e8,(ostream *)&std::cout), bVar1)) {
      sptk::SymmetricMatrix::~SymmetricMatrix(&local_e8);
      return true;
    }
    goto LAB_00105d81;
  case kPrecision:
    sptk::SymmetricMatrix::SymmetricMatrix(&local_e8,vector_length);
    bVar1 = sptk::StatisticsAccumulation::GetFullCovariance(accumulation,buffer,&local_e8);
    if (bVar1) {
      sptk::SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_78,vector_length);
      bVar1 = sptk::SymmetricMatrix::Invert(&local_e8,(SymmetricMatrix *)local_78);
      if (bVar1) {
        bVar1 = sptk::WriteStream((SymmetricMatrix *)local_78,(ostream *)&std::cout);
        sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_78);
        sptk::SymmetricMatrix::~SymmetricMatrix(&local_e8);
        if (bVar1) {
          return true;
        }
        return false;
      }
      sptk::SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_78);
    }
LAB_00105d81:
    sptk::SymmetricMatrix::~SymmetricMatrix(&local_e8);
    return false;
  case kMeanAndLowerAndUpperBounds:
    bVar1 = sptk::StatisticsAccumulation::GetNumData(accumulation,buffer,&local_ec);
    if (!bVar1) {
      return false;
    }
    __n = (size_type)vector_length;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,__n,(allocator_type *)local_78);
    bVar1 = sptk::StatisticsAccumulation::GetMean
                      (accumulation,buffer,(vector<double,_std::allocator<double>_> *)&local_e8);
    if (!bVar1) goto LAB_00105d3e;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_78,__n,(allocator_type *)&local_a8);
    bVar1 = sptk::StatisticsAccumulation::GetDiagonalCovariance
                      (accumulation,buffer,(vector<double,_std::allocator<double>_> *)local_78);
    if (bVar1) {
      std::vector<double,_std::allocator<double>_>::vector
                (&local_a8,__n,(allocator_type *)&local_90);
      std::vector<double,_std::allocator<double>_>::vector(&local_90,__n,&local_ed);
      bVar1 = sptk::ComputeLowerAndUpperBounds
                        (local_38,local_ec,(vector<double,_std::allocator<double>_> *)&local_e8,
                         (vector<double,_std::allocator<double>_> *)local_78,&local_a8,&local_90);
      if ((bVar1) &&
         (bVar1 = sptk::WriteStream<double>
                            (0,vector_length,&local_a8,(ostream *)&std::cout,(int *)0x0), bVar1)) {
        bVar1 = sptk::WriteStream<double>
                          (0,vector_length,&local_90,(ostream *)&std::cout,(int *)0x0);
      }
      else {
        bVar1 = false;
      }
      if ((void *)CONCAT44(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           (int)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_90.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         (int)local_90.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start));
      }
      if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar1 = false;
    }
    if ((_func_int **)local_78._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_78._0_8_);
    }
    break;
  case kSufficientStatistics:
    bVar1 = sptk::StatisticsAccumulation::GetNumData(accumulation,buffer,(int *)&local_90);
    if (!bVar1) {
      return false;
    }
    bVar1 = sptk::WriteStream<double>
                      ((double)(int)local_90.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start,(ostream *)&std::cout);
    if (!bVar1) {
      return false;
    }
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_68 = (pointer)0x0;
    bVar1 = sptk::StatisticsAccumulation::GetFirst
                      (accumulation,buffer,(vector<double,_std::allocator<double>_> *)local_78);
    if ((bVar1) &&
       (bVar1 = sptk::WriteStream<double>
                          (0,vector_length,(vector<double,_std::allocator<double>_> *)local_78,
                           (ostream *)&std::cout,(int *)0x0), bVar1)) {
      sptk::SymmetricMatrix::SymmetricMatrix(&local_e8,0);
      bVar1 = sptk::StatisticsAccumulation::GetSecond(accumulation,buffer,&local_e8);
      if (bVar1) {
        if (outputs_only_diagonal_elements) {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_a8,(long)vector_length,(allocator_type *)&local_ec);
          bVar1 = sptk::SymmetricMatrix::GetDiagonal(&local_e8,&local_a8);
          if (bVar1) {
            bVar1 = sptk::WriteStream<double>
                              (0,vector_length,&local_a8,(ostream *)&std::cout,(int *)0x0);
            if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
            }
            if (bVar1) goto LAB_00105df7;
          }
          else if (local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          goto LAB_00105e0a;
        }
        bVar1 = sptk::WriteStream(&local_e8,(ostream *)&std::cout);
        if (!bVar1) goto LAB_00105e0a;
LAB_00105df7:
        bVar1 = true;
      }
      else {
LAB_00105e0a:
        bVar1 = false;
      }
      sptk::SymmetricMatrix::~SymmetricMatrix(&local_e8);
      local_e8._vptr_SymmetricMatrix = (_func_int **)local_78._0_8_;
    }
    else {
      bVar1 = false;
      local_e8._vptr_SymmetricMatrix = (_func_int **)local_78._0_8_;
    }
    break;
  default:
    goto LAB_00105d8d;
  }
  if (local_e8._vptr_SymmetricMatrix != (_func_int **)0x0) {
    operator_delete(local_e8._vptr_SymmetricMatrix);
  }
  if (bVar1 == false) {
    return false;
  }
LAB_00105d8d:
  return true;
}

Assistant:

bool OutputStatistics(const sptk::StatisticsAccumulation& accumulation,
                      const sptk::StatisticsAccumulation::Buffer& buffer,
                      int vector_length, OutputFormats output_format,
                      double confidence_level,
                      bool outputs_only_diagonal_elements) {
  if (kMeanAndCovariance == output_format || kMean == output_format ||
      kMeanAndLowerAndUpperBounds == output_format) {
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, mean, &std::cout, NULL)) {
      return false;
    }
  }

  if (kMeanAndCovariance == output_format || kCovariance == output_format) {
    if (outputs_only_diagonal_elements) {
      std::vector<double> variance(vector_length);
      if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, variance, &std::cout, NULL)) {
        return false;
      }
    } else {
      sptk::SymmetricMatrix variance(vector_length);
      if (!accumulation.GetFullCovariance(buffer, &variance)) {
        return false;
      }
      if (!sptk::WriteStream(variance, &std::cout)) {
        return false;
      }
    }
  }

  if (kStandardDeviation == output_format) {
    std::vector<double> standard_deviation(vector_length);
    if (!accumulation.GetStandardDeviation(buffer, &standard_deviation)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, standard_deviation, &std::cout,
                           NULL)) {
      return false;
    }
  }

  if (kCorrelation == output_format) {
    sptk::SymmetricMatrix correlation(vector_length);
    if (!accumulation.GetCorrelation(buffer, &correlation)) {
      return false;
    }
    if (!sptk::WriteStream(correlation, &std::cout)) {
      return false;
    }
  }

  if (kPrecision == output_format) {
    sptk::SymmetricMatrix variance(vector_length);
    if (!accumulation.GetFullCovariance(buffer, &variance)) {
      return false;
    }

    sptk::SymmetricMatrix precision_matrix(vector_length);
    if (!variance.Invert(&precision_matrix)) {
      return false;
    }

    if (!sptk::WriteStream(precision_matrix, &std::cout)) {
      return false;
    }
  }

  if (kMeanAndLowerAndUpperBounds == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    std::vector<double> mean(vector_length);
    if (!accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    std::vector<double> variance(vector_length);
    if (!accumulation.GetDiagonalCovariance(buffer, &variance)) {
      return false;
    }

    std::vector<double> lower_bound(vector_length);
    std::vector<double> upper_bound(vector_length);
    if (!sptk::ComputeLowerAndUpperBounds(confidence_level, num_data, mean,
                                          variance, &lower_bound,
                                          &upper_bound)) {
      return false;
    }

    if (!sptk::WriteStream(0, vector_length, lower_bound, &std::cout, NULL)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, upper_bound, &std::cout, NULL)) {
      return false;
    }
  }

  if (kSufficientStatistics == output_format) {
    int num_data;
    if (!accumulation.GetNumData(buffer, &num_data)) {
      return false;
    }
    if (!sptk::WriteStream(static_cast<double>(num_data), &std::cout)) {
      return false;
    }

    std::vector<double> first;
    if (!accumulation.GetFirst(buffer, &first)) {
      return false;
    }
    if (!sptk::WriteStream(0, vector_length, first, &std::cout, NULL)) {
      return false;
    }

    sptk::SymmetricMatrix second;
    if (!accumulation.GetSecond(buffer, &second)) {
      return false;
    }
    if (outputs_only_diagonal_elements) {
      std::vector<double> tmp(vector_length);
      if (!second.GetDiagonal(&tmp)) {
        return false;
      }
      if (!sptk::WriteStream(0, vector_length, tmp, &std::cout, NULL)) {
        return false;
      }
    } else {
      if (!sptk::WriteStream(second, &std::cout)) {
        return false;
      }
    }
  }

  return true;
}